

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O0

void __thiscall
cmLocalUnixMakefileGenerator3::CreateCDCommand
          (cmLocalUnixMakefileGenerator3 *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *commands,char *tgtDir,RelativeRoot relRetDir)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  plus<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_1e9;
  binder1st<std::plus<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1e8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1c0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1b8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  undefined1 local_188 [8];
  string prefix;
  string local_160;
  undefined1 local_140 [8];
  string outputForExisting;
  string local_118;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_d0;
  const_iterator local_c8;
  allocator local_b9;
  string local_b8;
  string local_98;
  allocator local_61;
  undefined1 local_60 [8];
  string cmd;
  cmGlobalUnixMakefileGenerator3 *gg;
  char *cd_cmd;
  char *retDir;
  RelativeRoot relRetDir_local;
  char *tgtDir_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *commands_local;
  cmLocalUnixMakefileGenerator3 *this_local;
  
  pcVar3 = cmOutputConverter::GetRelativeRootPath
                     (&(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                       super_cmOutputConverter,relRetDir);
  iVar2 = strcmp(tgtDir,pcVar3);
  if (iVar2 != 0) {
    bVar1 = cmLocalGenerator::IsMinGWMake((cmLocalGenerator *)this);
    pcVar3 = "cd ";
    if (bVar1) {
      pcVar3 = "cd /d ";
    }
    cmd.field_2._8_8_ = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator;
    if (((((cmGlobalGenerator *)(cmd.field_2._8_8_ + 0x530))->MakeSilentFlag).field_2._M_local_buf
         [2] & 1U) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)local_60,pcVar3,&local_61);
      std::allocator<char>::~allocator((allocator<char> *)&local_61);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_b8,tgtDir,&local_b9);
      cmOutputConverter::ConvertToOutputForExisting
                (&local_98,
                 &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                  super_cmOutputConverter,&local_b8,relRetDir,SHELL);
      std::__cxx11::string::operator+=((string *)local_60,(string *)&local_98);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&local_b8);
      std::allocator<char>::~allocator((allocator<char> *)&local_b9);
      local_d0._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(commands);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
      ::__normal_iterator<std::__cxx11::string*>
                ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  *)&local_c8,&local_d0);
      local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::insert(commands,local_c8,(value_type *)local_60);
      std::__cxx11::string::operator=((string *)local_60,pcVar3);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_118,tgtDir,
                 (allocator *)(outputForExisting.field_2._M_local_buf + 0xf));
      cmOutputConverter::ConvertToOutputForExisting
                (&local_f8,
                 &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                  super_cmOutputConverter,relRetDir,&local_118,SHELL);
      std::__cxx11::string::operator+=((string *)local_60,(string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_118);
      std::allocator<char>::~allocator
                ((allocator<char> *)(outputForExisting.field_2._M_local_buf + 0xf));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(commands,(value_type *)local_60);
      std::__cxx11::string::~string((string *)local_60);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_160,tgtDir,(allocator *)(prefix.field_2._M_local_buf + 0xf));
      cmOutputConverter::ConvertToOutputForExisting
                ((string *)local_140,
                 &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                  super_cmOutputConverter,&local_160,relRetDir,SHELL);
      std::__cxx11::string::~string((string *)&local_160);
      std::allocator<char>::~allocator((allocator<char> *)(prefix.field_2._M_local_buf + 0xf));
      std::operator+(&local_1a8,pcVar3,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140)
      ;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188,
                     &local_1a8," && ");
      std::__cxx11::string::~string((string *)&local_1a8);
      local_1b0._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(commands);
      local_1b8._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(commands);
      local_1c0._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(commands);
      std::bind1st<std::plus<std::__cxx11::string>,std::__cxx11::string>
                (&local_1e8,&local_1e9,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188);
      std::
      transform<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::binder1st<std::plus<std::__cxx11::string>>>
                (local_1b0,local_1b8,local_1c0,&local_1e8);
      std::
      binder1st<std::plus<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~binder1st(&local_1e8);
      std::__cxx11::string::~string((string *)local_188);
      std::__cxx11::string::~string((string *)local_140);
    }
  }
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3
::CreateCDCommand(std::vector<std::string>& commands, const char *tgtDir,
                  cmLocalGenerator::RelativeRoot relRetDir)
{
  const char* retDir = this->GetRelativeRootPath(relRetDir);

  // do we need to cd?
  if (!strcmp(tgtDir,retDir))
    {
    return;
    }

  // In a Windows shell we must change drive letter too.  The shell
  // used by NMake and Borland make does not support "cd /d" so this
  // feature simply cannot work with them (Borland make does not even
  // support changing the drive letter with just "d:").
  const char* cd_cmd = this->IsMinGWMake() ? "cd /d " : "cd ";

  cmGlobalUnixMakefileGenerator3* gg =
    static_cast<cmGlobalUnixMakefileGenerator3*>(this->GlobalGenerator);
  if(!gg->UnixCD)
    {
    // On Windows we must perform each step separately and then change
    // back because the shell keeps the working directory between
    // commands.
    std::string cmd = cd_cmd;
    cmd += this->ConvertToOutputForExisting(tgtDir, relRetDir);
    commands.insert(commands.begin(),cmd);

    // Change back to the starting directory.
    cmd = cd_cmd;
    cmd += this->ConvertToOutputForExisting(relRetDir, tgtDir);
    commands.push_back(cmd);
    }
  else
    {
    // On UNIX we must construct a single shell command to change
    // directory and build because make resets the directory between
    // each command.
    std::string outputForExisting =
                          this->ConvertToOutputForExisting(tgtDir, relRetDir);
    std::string prefix = cd_cmd + outputForExisting + " && ";
    std::transform(commands.begin(), commands.end(), commands.begin(),
                   std::bind1st(std::plus<std::string>(), prefix));
    }
}